

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumOptions * __thiscall
google::protobuf::EnumDescriptorProto::_internal_mutable_options(EnumDescriptorProto *this)

{
  EnumOptions *pEVar1;
  long in_RDI;
  EnumOptions *p;
  EnumDescriptorProto *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 2;
  if (*(long *)(in_RDI + 0x68) == 0) {
    GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    pEVar1 = MessageLite::CreateMaybeMessage<google::protobuf::EnumOptions>((Arena *)0x618f81);
    *(EnumOptions **)(in_RDI + 0x68) = pEVar1;
  }
  return *(EnumOptions **)(in_RDI + 0x68);
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::EnumOptions* EnumDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::EnumOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}